

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O0

void __thiscall
bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
::reset(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this
       ,size_t width,size_t size)

{
  word_type wVar1;
  size_t in_RSI;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  if (in_RSI != in_RDI->_width) {
    in_RDI->_width = in_RSI;
    wVar1 = compute_field_mask(in_RSI);
    in_RDI->_field_mask = wVar1;
  }
  resize(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void reset(size_t width, size_t size) {
                assert(size == 0 || width != 0);
                
                if(width != _width) {
                    _width = width;
                    _field_mask = compute_field_mask(width);
                }
                resize(size);
            }